

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

void __thiscall re2::RE2::RE2(RE2 *this,string *pattern)

{
  string *in_RDI;
  string *str;
  StringPiece *this_00;
  Options *in_stack_00000470;
  StringPiece *in_stack_00000478;
  RE2 *in_stack_00000480;
  Options local_48 [3];
  
  std::__cxx11::string::string(in_RDI);
  Options::Options((Options *)(in_RDI + 0x20));
  str = (string *)(in_RDI + 0x38);
  std::__cxx11::string::string((string *)str);
  this_00 = (StringPiece *)(in_RDI + 0x98);
  std::__cxx11::string::string((string *)this_00);
  std::once_flag::once_flag((once_flag *)(in_RDI + 200));
  std::once_flag::once_flag((once_flag *)(in_RDI + 0xcc));
  std::once_flag::once_flag((once_flag *)(in_RDI + 0xd0));
  StringPiece::StringPiece(this_00,str);
  Options::Options(local_48,DefaultOptions);
  Init(in_stack_00000480,in_stack_00000478,in_stack_00000470);
  return;
}

Assistant:

RE2::RE2(const std::string& pattern) {
  Init(pattern, DefaultOptions);
}